

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintTwoBodies.cpp
# Opt level: O2

void __thiscall
chrono::ChConstraintTwoBodies::MultiplyTandAdd
          (ChConstraintTwoBodies *this,ChVectorDynamic<double> *result,double l)

{
  double l_local;
  ChRowVectorN<double,_6> *local_80;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  local_78;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>> local_58 [56];
  
  l_local = l;
  if (((this->super_ChConstraintTwo).variables_a)->disabled == false) {
    local_80 = &this->Cq_a;
    Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,1,6,1,1,6>>>::operator*
              (&local_78,(MatrixBase<Eigen::Transpose<Eigen::Matrix<double,1,6,1,1,6>>> *)&local_80,
               &l_local);
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_58,result,
               (long)((this->super_ChConstraintTwo).variables_a)->offset,6);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>>::operator+=
              (local_58,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>
                         *)&local_78);
  }
  if (((this->super_ChConstraintTwo).variables_b)->disabled == false) {
    local_80 = &this->Cq_b;
    Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,1,6,1,1,6>>>::operator*
              (&local_78,(MatrixBase<Eigen::Transpose<Eigen::Matrix<double,1,6,1,1,6>>> *)&local_80,
               &l_local);
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_58,result,
               (long)((this->super_ChConstraintTwo).variables_b)->offset,6);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>>::operator+=
              (local_58,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>
                         *)&local_78);
  }
  return;
}

Assistant:

void ChConstraintTwoBodies::MultiplyTandAdd(ChVectorDynamic<double>& result, double l) {
    if (variables_a->IsActive()) {
        result.segment(variables_a->GetOffset(), 6) += Cq_a.transpose() * l;
    }

    if (variables_b->IsActive()) {
        result.segment(variables_b->GetOffset(), 6) += Cq_b.transpose() * l;
    }
}